

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

size_t __thiscall
adios2::format::BP5Deserializer::WriterCohortSize(BP5Deserializer *this,size_t Step)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  pointer local_8;
  
  if (((ulong)in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    local_8 = in_RDI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI + 3);
    if (in_RSI < sVar1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI + 3,in_RSI);
      local_8 = (pointer)*pvVar2;
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(in_RDI);
      local_8 = (pointer)*pvVar2;
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t BP5Deserializer::WriterCohortSize(size_t Step) const
{
    if (m_RandomAccessMode)
    {
        if (Step < m_WriterCohortSize.size())
        {
            return m_WriterCohortSize[Step];
        }
        else
        {
            return m_WriterCohortSize.back();
        }
    }
    else
    {
        return m_CurrentWriterCohortSize;
    }
}